

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int list_size_aux(List *ls,int level)

{
  int iVar1;
  int iVar2;
  int level_local;
  List *ls_local;
  
  if (1000 < level) {
    abort();
  }
  if (ls == (List *)0x0) {
    ls_local._4_4_ = 0;
  }
  else {
    iVar1 = list_size_aux(ls->car,level + 1);
    iVar2 = list_size_aux(ls->cdr,level + 1);
    ls_local._4_4_ = iVar1 + 1 + iVar2;
  }
  return ls_local._4_4_;
}

Assistant:

static int
list_size_aux (const List *ls, int level)
{
  if (level > 1000)  /* avoid infinite death */
    abort ();
  if (ls == NULL)  /* Recursion base case. */
    return 0;
  return (1 + list_size_aux (ls->car, level + 1)
	  + list_size_aux (ls->cdr, level + 1));
}